

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview_p.h
# Opt level: O0

bool __thiscall QListViewItem::operator==(QListViewItem *this,QListViewItem *other)

{
  bool local_11;
  QListViewItem *other_local;
  QListViewItem *this_local;
  
  local_11 = false;
  if ((((this->x == other->x) && (local_11 = false, this->y == other->y)) &&
      (local_11 = false, this->w == other->w)) && (local_11 = false, this->h == other->h)) {
    local_11 = this->indexHint == other->indexHint;
  }
  return local_11;
}

Assistant:

constexpr bool operator==(const QListViewItem &other) const {
        return (x == other.x && y == other.y && w == other.w && h == other.h &&
                indexHint == other.indexHint); }